

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFSCharter.cpp
# Opt level: O0

void __thiscall FSCConnection::FSCConnection(FSCConnection *this)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  char url [128];
  undefined4 in_stack_ffffffffffffff08;
  LTChannelType in_stack_ffffffffffffff0c;
  array<FSCEnvTy,_2UL> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  LTFlightDataChannel *in_stack_ffffffffffffff20;
  char local_98 [152];
  
  LTFlightDataChannel::LTFlightDataChannel
            (in_stack_ffffffffffffff20,(dataRefsLT)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (char *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  *in_RDI = &PTR__FSCConnection_0046d040;
  std::__cxx11::string::string((string *)(in_RDI + 0x3d));
  *(undefined4 *)(in_RDI + 0x41) = 0;
  in_RDI[0x42] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x43));
  std::__cxx11::string::string((string *)(in_RDI + 0x47));
  std::__cxx11::string::string((string *)(in_RDI + 0x4b));
  std::__cxx11::string::string((string *)(in_RDI + 0x4f));
  in_RDI[0x53] = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 5),anon_var_dwarf_301eb7 + 4);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"https://fscharter.net/flight-board");
  std::__cxx11::string::operator=((string *)(in_RDI + 9),"See who\'s flying in FSCharter just now");
  local_98[0x70] = '\0';
  local_98[0x71] = '\0';
  local_98[0x72] = '\0';
  local_98[0x73] = '\0';
  local_98[0x74] = '\0';
  local_98[0x75] = '\0';
  local_98[0x76] = '\0';
  local_98[0x77] = '\0';
  local_98[0x78] = '\0';
  local_98[0x79] = '\0';
  local_98[0x7a] = '\0';
  local_98[0x7b] = '\0';
  local_98[0x7c] = '\0';
  local_98[0x7d] = '\0';
  local_98[0x7e] = '\0';
  local_98[0x7f] = '\0';
  local_98[0x60] = '\0';
  local_98[0x61] = '\0';
  local_98[0x62] = '\0';
  local_98[99] = '\0';
  local_98[100] = '\0';
  local_98[0x65] = '\0';
  local_98[0x66] = '\0';
  local_98[0x67] = '\0';
  local_98[0x68] = '\0';
  local_98[0x69] = '\0';
  local_98[0x6a] = '\0';
  local_98[0x6b] = '\0';
  local_98[0x6c] = '\0';
  local_98[0x6d] = '\0';
  local_98[0x6e] = '\0';
  local_98[0x6f] = '\0';
  local_98[0x50] = '\0';
  local_98[0x51] = '\0';
  local_98[0x52] = '\0';
  local_98[0x53] = '\0';
  local_98[0x54] = '\0';
  local_98[0x55] = '\0';
  local_98[0x56] = '\0';
  local_98[0x57] = '\0';
  local_98[0x58] = '\0';
  local_98[0x59] = '\0';
  local_98[0x5a] = '\0';
  local_98[0x5b] = '\0';
  local_98[0x5c] = '\0';
  local_98[0x5d] = '\0';
  local_98[0x5e] = '\0';
  local_98[0x5f] = '\0';
  local_98[0x40] = '\0';
  local_98[0x41] = '\0';
  local_98[0x42] = '\0';
  local_98[0x43] = '\0';
  local_98[0x44] = '\0';
  local_98[0x45] = '\0';
  local_98[0x46] = '\0';
  local_98[0x47] = '\0';
  local_98[0x48] = '\0';
  local_98[0x49] = '\0';
  local_98[0x4a] = '\0';
  local_98[0x4b] = '\0';
  local_98[0x4c] = '\0';
  local_98[0x4d] = '\0';
  local_98[0x4e] = '\0';
  local_98[0x4f] = '\0';
  local_98[0x30] = '\0';
  local_98[0x31] = '\0';
  local_98[0x32] = '\0';
  local_98[0x33] = '\0';
  local_98[0x34] = '\0';
  local_98[0x35] = '\0';
  local_98[0x36] = '\0';
  local_98[0x37] = '\0';
  local_98[0x38] = '\0';
  local_98[0x39] = '\0';
  local_98[0x3a] = '\0';
  local_98[0x3b] = '\0';
  local_98[0x3c] = '\0';
  local_98[0x3d] = '\0';
  local_98[0x3e] = '\0';
  local_98[0x3f] = '\0';
  local_98[0x20] = '\0';
  local_98[0x21] = '\0';
  local_98[0x22] = '\0';
  local_98[0x23] = '\0';
  local_98[0x24] = '\0';
  local_98[0x25] = '\0';
  local_98[0x26] = '\0';
  local_98[0x27] = '\0';
  local_98[0x28] = '\0';
  local_98[0x29] = '\0';
  local_98[0x2a] = '\0';
  local_98[0x2b] = '\0';
  local_98[0x2c] = '\0';
  local_98[0x2d] = '\0';
  local_98[0x2e] = '\0';
  local_98[0x2f] = '\0';
  local_98[0x10] = '\0';
  local_98[0x11] = '\0';
  local_98[0x12] = '\0';
  local_98[0x13] = '\0';
  local_98[0x14] = '\0';
  local_98[0x15] = '\0';
  local_98[0x16] = '\0';
  local_98[0x17] = '\0';
  local_98[0x18] = '\0';
  local_98[0x19] = '\0';
  local_98[0x1a] = '\0';
  local_98[0x1b] = '\0';
  local_98[0x1c] = '\0';
  local_98[0x1d] = '\0';
  local_98[0x1e] = '\0';
  local_98[0x1f] = '\0';
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = '\0';
  local_98[9] = '\0';
  local_98[10] = '\0';
  local_98[0xb] = '\0';
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  DataRefs::GetFSCEnv(&dataRefs);
  std::array<FSCEnvTy,_2UL>::at
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
            );
  uVar1 = std::__cxx11::string::c_str();
  snprintf(local_98,0x80,"https://%s/",uVar1);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x3d),local_98);
  return;
}

Assistant:

FSCConnection::FSCConnection () :
LTFlightDataChannel(DR_CHANNEL_FSCHARTER, FSC_NAME)
{
    // purely informational
    urlName  = FSC_CHECK_NAME;
    urlLink  = FSC_CHECK_URL;
    urlPopup = FSC_CHECK_POPUP;
    
    // base URL depends on environment in use
    char url[128] = "";
    snprintf(url, sizeof(url),
             FSC_BASE_URL,
             FSC_ENV.at(dataRefs.GetFSCEnv()).server.c_str());
    base_url = url;
}